

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration * __thiscall absl::lts_20250127::Duration::operator%=(Duration *this,Duration rhs)

{
  Duration den;
  Duration num;
  bool bVar1;
  Duration *this_local;
  Duration rhs_local;
  int64_t local_60;
  int64_t q;
  byte local_49;
  HiRep local_48;
  uint32_t local_40;
  HiRep local_38;
  uint32_t local_30;
  HiRep local_2c;
  uint32_t local_24;
  HiRep local_1c;
  uint32_t local_14;
  
  local_40 = rhs.rep_lo_;
  local_48 = rhs.rep_hi_;
  local_2c = this->rep_hi_;
  local_24 = this->rep_lo_;
  local_49 = 0;
  local_60 = 0;
  q = (int64_t)this;
  local_38 = local_48;
  local_30 = local_40;
  local_1c = local_2c;
  local_14 = local_24;
  bVar1 = anon_unknown_1::IDivFastPath(*this,rhs,&local_60,this);
  if (!bVar1) {
    num.rep_lo_ = local_14;
    num.rep_hi_ = local_1c;
    den.rep_lo_ = local_30;
    den.rep_hi_ = local_38;
    anon_unknown_1::IDivSlowPath((bool)(local_49 & 1),num,den,(Duration *)q);
  }
  return this;
}

Assistant:

Duration& Duration::operator%=(Duration rhs) {
  IDivDurationImpl(false, *this, rhs, this);
  return *this;
}